

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# end.c
# Opt level: O2

void list_vanquished(char defquery,boolean ask)

{
  nh_menuitem *pnVar1;
  byte bVar2;
  boolean bVar3;
  schar *psVar4;
  char *pcVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  char *pcVar10;
  char *__format;
  permonst *pm;
  int iVar11;
  menulist menu;
  char buf [256];
  
  psVar4 = &mons[0].mlevel;
  lVar8 = 0;
  iVar11 = 0;
  iVar9 = 0;
  for (lVar6 = 1; lVar6 != 0x4ba; lVar6 = lVar6 + 3) {
    iVar9 = (iVar9 + 1) - (uint)((ulong)(&mvitals[0].born)[lVar6] == 0);
    lVar8 = lVar8 + (ulong)(&mvitals[0].born)[lVar6];
    if (iVar11 <= *psVar4) {
      iVar11 = (int)*psVar4;
    }
    psVar4 = psVar4 + 0x40;
  }
  if (iVar9 == 0) {
    return;
  }
  if (ask != '\0') {
    defquery = yn_function("Do you want an account of creatures vanquished?","ynq",defquery);
  }
  if (defquery != 'y') {
    if (defquery != 'q') {
      return;
    }
    program_state.stopprint = program_state.stopprint + 1;
    return;
  }
  init_menulist(&menu);
  do {
    if (iVar11 < 0) {
      if (((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) &&
         ((u.umonnum == u.umonster || (bVar3 = dmgtype(youmonst.data,0x24), bVar3 == '\0')))) {
        lVar6 = (long)menu.size;
        if (menu.size <= menu.icount) {
          menu.size = menu.size * 2;
          menu.items = (nh_menuitem *)realloc(menu.items,lVar6 * 0x218);
        }
        menu.items[menu.icount].id = 0;
        menu.items[menu.icount].role = MI_TEXT;
        menu.items[menu.icount].accel = '\0';
        menu.items[menu.icount].group_accel = '\0';
        menu.items[menu.icount].selected = '\0';
        builtin_strncpy(menu.items[menu.icount].caption,"and a partridge ",0x10);
        builtin_strncpy(menu.items[menu.icount].caption + 0xf," in a pear tree",0x10);
        menu.icount = menu.icount + 1;
      }
      if (iVar9 != 1) {
        lVar6 = (long)menu.size;
        if (menu.size <= menu.icount) {
          menu.size = menu.size * 2;
          menu.items = (nh_menuitem *)realloc(menu.items,lVar6 * 0x218);
        }
        lVar6 = (long)menu.icount;
        menu.items[lVar6].accel = '\0';
        menu.items[lVar6].group_accel = '\0';
        menu.items[lVar6].selected = '\0';
        menu.items[lVar6].id = 0;
        menu.items[lVar6].role = MI_TEXT;
        menu.items[lVar6].caption[0] = '\0';
        menu.icount = menu.icount + 1;
        sprintf(buf,"%ld creatures vanquished.",lVar8);
        lVar6 = (long)menu.size;
        if (menu.size <= menu.icount) {
          menu.size = menu.size * 2;
          menu.items = (nh_menuitem *)realloc(menu.items,lVar6 * 0x218);
        }
        pnVar1 = menu.items + menu.icount;
        pnVar1->id = 0;
        pnVar1->role = MI_TEXT;
        pnVar1->accel = '\0';
        pnVar1->group_accel = '\0';
        pnVar1->selected = '\0';
        strcpy(pnVar1->caption,buf);
        menu.icount = menu.icount + 1;
      }
      display_menu(menu.items,menu.icount,"Vanquished creatures:",0,(int *)0x0);
      free(menu.items);
      return;
    }
    pm = mons;
    for (lVar6 = -0x4b9; lVar6 != 0; lVar6 = lVar6 + 3) {
      if ((iVar11 == pm->mlevel) && (bVar2 = *(byte *)(lVar6 + 0x3144ca), bVar2 != 0)) {
        if ((lVar6 == -0x159) || ((pm->geno & 0x1000) == 0)) {
          pcVar10 = mons_mname(pm);
          if (bVar2 == 1) {
            pcVar10 = an(pcVar10);
            strcpy(buf,pcVar10);
          }
          else {
            pcVar5 = makeplural(pcVar10);
            __format = "%d %s";
            pcVar10 = buf;
LAB_0019285c:
            sprintf(pcVar10,__format,(ulong)bVar2,pcVar5);
          }
        }
        else {
          pcVar10 = "";
          if ((pm->mflags2 & 0x80000) == 0) {
            pcVar10 = "The ";
          }
          pcVar5 = mons_mname(pm);
          sprintf(buf,"%s%s",pcVar10,pcVar5);
          if (bVar2 != 1) {
            if (bVar2 == 3) {
              pcVar10 = eos(buf);
              builtin_strncpy(pcVar10," (thrice)",10);
            }
            else {
              if (bVar2 != 2) {
                pcVar10 = eos(buf);
                __format = " (%d time%s)";
                pcVar5 = "s";
                goto LAB_0019285c;
              }
              pcVar10 = eos(buf);
              builtin_strncpy(pcVar10," (twice)",9);
            }
          }
        }
        lVar7 = (long)menu.size;
        if (menu.size <= menu.icount) {
          menu.size = menu.size * 2;
          menu.items = (nh_menuitem *)realloc(menu.items,lVar7 * 0x218);
        }
        pnVar1 = menu.items + menu.icount;
        pnVar1->id = 0;
        pnVar1->role = MI_TEXT;
        pnVar1->accel = '\0';
        pnVar1->group_accel = '\0';
        pnVar1->selected = '\0';
        strcpy(pnVar1->caption,buf);
        menu.icount = menu.icount + 1;
      }
      pm = pm + 1;
    }
    iVar11 = iVar11 + -1;
  } while( true );
}

Assistant:

void list_vanquished(char defquery, boolean ask)
{
    int i, lev;
    int ntypes = 0, max_lev = 0, nkilled;
    long total_killed = 0L;
    char c;
    char buf[BUFSZ];
    struct menulist menu;

    /* get totals first */
    for (i = LOW_PM; i < NUMMONS; i++) {
	if (mvitals[i].died) ntypes++;
	total_killed += (long)mvitals[i].died;
	if (mons[i].mlevel > max_lev) max_lev = mons[i].mlevel;
    }

    /* vanquished creatures list;
     * includes all dead monsters, not just those killed by the player
     */
    if (ntypes != 0) {
	c = ask ? yn_function("Do you want an account of creatures vanquished?",
			      ynqchars, defquery) : defquery;
	if (c == 'q') done_stopprint++;
	if (c == 'y') {
	    init_menulist(&menu);

	    /* countdown by monster "toughness" */
	    for (lev = max_lev; lev >= 0; lev--)
	      for (i = LOW_PM; i < NUMMONS; i++)
		if (mons[i].mlevel == lev && (nkilled = mvitals[i].died) > 0) {
		    if ((mons[i].geno & G_UNIQ) && i != PM_HIGH_PRIEST) {
			sprintf(buf, "%s%s",
				!type_is_pname(&mons[i]) ? "The " : "",
				mons_mname(&mons[i]));
			if (nkilled > 1) {
			    switch (nkilled) {
				case 2:  sprintf(eos(buf)," (twice)");  break;
				case 3:  sprintf(eos(buf)," (thrice)");  break;
				default: sprintf(eos(buf)," (%d time%s)",
						 nkilled, plur(nkilled));
					 break;
			    }
			}
		    } else {
			/* trolls or undead might have come back,
			   but we don't keep track of that */
			if (nkilled == 1)
			    strcpy(buf, an(mons_mname(&mons[i])));
			else
			    sprintf(buf, "%d %s",
				    nkilled, makeplural(mons_mname(&mons[i])));
		    }
		    add_menutext(&menu,  buf);
		}

	    if (Hallucination)
		add_menutext(&menu, "and a partridge in a pear tree");

	    if (ntypes > 1) {
		add_menutext(&menu,  "");
		sprintf(buf, "%ld creatures vanquished.", total_killed);
		add_menutext(&menu,  buf);
	    }
	    display_menu(menu.items, menu.icount, "Vanquished creatures:", PICK_NONE, NULL);
	    free(menu.items);
	}
    }
}